

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderStairs<ImPlot::GetterYs<double>,ImPlot::TransformerLogLin>
               (GetterYs<double> *getter,TransformerLogLin *transformer,ImDrawList *DrawList,
               float line_weight,ImU32 col)

{
  float *pfVar1;
  double dVar2;
  double dVar3;
  ImPlotPlot *pIVar4;
  float fVar5;
  ImPlotContext *pIVar6;
  ImPlotContext *pIVar7;
  ImDrawList *this;
  int iVar8;
  int iVar9;
  ImPlotContext *gp;
  double dVar10;
  float fVar11;
  ImVec2 p2;
  ImVec2 p12;
  ImVec2 p1;
  ImVec2 local_78;
  ImVec2 local_70;
  ImDrawList *local_68;
  TransformerLogLin *local_60;
  undefined1 local_58 [8];
  TransformerLogLin *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar6 = GImPlot;
  pIVar4 = GImPlot->CurrentPlot;
  local_68 = DrawList;
  if (((pIVar4->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar8 = getter->Count;
    local_48 = iVar8 + -1;
    local_40 = line_weight * 0.5;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    dVar2 = *(double *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    dVar10 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar6->CurrentPlot;
    dVar3 = (pIVar4->XAxis).Range.Min;
    iVar8 = transformer->YAxis;
    local_3c.x = (float)((((double)(float)(dVar10 / pIVar6->LogDenX) *
                           ((pIVar4->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar6->Mx +
                        (double)pIVar6->PixelRange[iVar8].Min.x);
    local_3c.y = (float)((dVar2 - pIVar4->YAxis[iVar8].Range.Min) * pIVar6->My[iVar8] +
                        (double)pIVar6->PixelRange[iVar8].Min.y);
    RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterYs<double>,ImPlot::TransformerLogLin>>
              ((StairsRenderer<ImPlot::GetterYs<double>,_ImPlot::TransformerLogLin> *)local_58,
               local_68,&pIVar4->PlotRect);
  }
  else {
    iVar8 = getter->Count;
    dVar2 = *(double *)
             ((long)getter->Ys +
             (long)((getter->Offset % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
    dVar10 = log10((getter->XScale * 0.0 + getter->X0) / (pIVar4->XAxis).Range.Min);
    pIVar4 = pIVar6->CurrentPlot;
    dVar3 = (pIVar4->XAxis).Range.Min;
    iVar8 = transformer->YAxis;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar10 / pIVar6->LogDenX) * ((pIVar4->XAxis).Range.Max - dVar3) + dVar3)
          - dVar3) * pIVar6->Mx + (double)pIVar6->PixelRange[iVar8].Min.x);
    local_58._4_4_ =
         (float)((dVar2 - pIVar4->YAxis[iVar8].Range.Min) * pIVar6->My[iVar8] +
                (double)pIVar6->PixelRange[iVar8].Min.y);
    iVar8 = getter->Count;
    if (1 < iVar8) {
      iVar9 = 1;
      local_60 = transformer;
      do {
        pIVar7 = GImPlot;
        dVar2 = *(double *)
                 ((long)getter->Ys +
                 (long)(((getter->Offset + iVar9) % iVar8 + iVar8) % iVar8) * (long)getter->Stride);
        dVar10 = log10(((double)iVar9 * getter->XScale + getter->X0) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        this = local_68;
        pIVar4 = pIVar7->CurrentPlot;
        dVar3 = (pIVar4->XAxis).Range.Min;
        iVar8 = transformer->YAxis;
        local_78.x = (float)((((double)(float)(dVar10 / pIVar7->LogDenX) *
                               ((pIVar4->XAxis).Range.Max - dVar3) + dVar3) - dVar3) * pIVar7->Mx +
                            (double)pIVar7->PixelRange[iVar8].Min.x);
        fVar11 = (float)((dVar2 - pIVar4->YAxis[iVar8].Range.Min) * pIVar7->My[iVar8] +
                        (double)pIVar7->PixelRange[iVar8].Min.y);
        local_78.y = fVar11;
        pIVar4 = pIVar6->CurrentPlot;
        fVar5 = (float)local_58._4_4_;
        if (fVar11 <= (float)local_58._4_4_) {
          fVar5 = fVar11;
        }
        if ((fVar5 < (pIVar4->PlotRect).Max.y) &&
           (fVar5 = (float)(~-(uint)(fVar11 <= (float)local_58._4_4_) & (uint)fVar11 |
                           -(uint)(fVar11 <= (float)local_58._4_4_) & local_58._4_4_),
           pfVar1 = &(pIVar4->PlotRect).Min.y, *pfVar1 <= fVar5 && fVar5 != *pfVar1)) {
          fVar5 = (float)local_58._0_4_;
          if (local_78.x <= (float)local_58._0_4_) {
            fVar5 = local_78.x;
          }
          if ((fVar5 < (pIVar4->PlotRect).Max.x) &&
             (fVar5 = (float)(~-(uint)(local_78.x <= (float)local_58._0_4_) & (uint)local_78.x |
                             local_58._0_4_ & -(uint)(local_78.x <= (float)local_58._0_4_)),
             (pIVar4->PlotRect).Min.x <= fVar5 && fVar5 != (pIVar4->PlotRect).Min.x)) {
            local_70.y = (float)local_58._4_4_;
            local_70.x = local_78.x;
            ImDrawList::AddLine(local_68,(ImVec2 *)local_58,&local_70,col,line_weight);
            transformer = local_60;
            ImDrawList::AddLine(this,&local_70,&local_78,col,line_weight);
          }
        }
        local_58._0_4_ = local_78.x;
        local_58._4_4_ = local_78.y;
        iVar9 = iVar9 + 1;
        iVar8 = getter->Count;
      } while (iVar9 < iVar8);
    }
  }
  return;
}

Assistant:

inline void RenderStairs(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2)))) {
                ImVec2 p12(p2.x, p1.y);
                DrawList.AddLine(p1, p12, col, line_weight);
                DrawList.AddLine(p12, p2, col, line_weight);
            }
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(StairsRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}